

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O0

void parse_struct_union_specifier_finish
               (Translation_Data *translation_data,Scope *scope,Struct_Union *base)

{
  char cVar1;
  Struct_Union *base_local;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  cVar1 = get_and_check(translation_data,KW_OPEN_CURLY);
  if (cVar1 != '\0') {
    base->is_finished = '\x01';
    do {
      cVar1 = parse_struct_declaration
                        (translation_data,(Scope *)base->inner_namespace,base->members);
      if (cVar1 == '\0') {
        push_translation_error
                  ("expected closing curly bracket from struct declaration",translation_data);
        return;
      }
      cVar1 = get_and_check(translation_data,KW_CLOSE_CURLY);
    } while (cVar1 == '\0');
  }
  return;
}

Assistant:

void parse_struct_union_specifier_finish(struct Translation_Data *translation_data,struct Scope *scope,struct Struct_Union *base)
{
	if(get_and_check(translation_data,KW_OPEN_CURLY))
	{
		base->is_finished=1;
		while(parse_struct_declaration(translation_data,(struct Scope*)base->inner_namespace,base->members))
			if(get_and_check(translation_data,KW_CLOSE_CURLY))
				return ;
		/*TODO error*/
		push_translation_error("expected closing curly bracket from struct declaration",translation_data);
		return;
	}
}